

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint filter(uchar *out,uchar *in,uint w,uint h,LodePNGColorMode *info,
           LodePNGEncoderSettings *settings)

{
  uchar filterType;
  byte bVar1;
  uchar *puVar2;
  void *pvVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uchar *puVar11;
  long lVar12;
  ulong uVar13;
  uchar *puVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  bool bVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined8 *in_stack_00000008;
  uchar *dummy;
  size_t size [5];
  uchar *attempt [5];
  uint count [256];
  uchar *local_4f0;
  uchar *local_4a0;
  ulong auStack_498 [6];
  long alStack_468 [6];
  LodePNGCompressSettings local_438 [21];
  ulong length;
  
  uVar8 = (ulong)h;
  iVar16 = 0;
  if ((uint)info < 7) {
    iVar16 = *(int *)(&DAT_00115b24 + ((ulong)info & 0xffffffff) * 4);
  }
  iVar16 = iVar16 * (uint)settings;
  if (iVar16 == 0) {
    uVar5 = 0x1f;
  }
  else {
    uVar5 = *(uint *)(in_stack_00000008 + 7);
    if ((uint)settings < 8) {
      uVar5 = 0;
    }
    if ((uint)info == 3) {
      uVar5 = 0;
    }
    if (*(int *)((long)in_stack_00000008 + 0x34) == 0) {
      uVar5 = *(uint *)(in_stack_00000008 + 7);
    }
    if (uVar5 < 5) {
      uVar7 = w * iVar16 + 7;
      uVar19 = uVar7 >> 3;
      length = (ulong)uVar19;
      uVar10 = (ulong)(iVar16 + 7U >> 3);
      switch(uVar5) {
      case 0:
        if (h != 0) {
          puVar11 = out + 1;
          uVar10 = 0;
          do {
            out[(length + 1) * uVar10] = '\0';
            if (7 < uVar7) {
              uVar9 = 0;
              do {
                puVar11[uVar9] = in[uVar9];
                uVar9 = uVar9 + 1;
              } while (length != uVar9);
            }
            uVar10 = uVar10 + 1;
            puVar11 = puVar11 + length + 1;
            in = in + length;
          } while (uVar10 != uVar8);
        }
        break;
      case 1:
        lVar17 = 0;
        do {
          pvVar3 = malloc(length);
          *(void **)(&local_438[0].btype + lVar17 * 2) = pvVar3;
          if (pvVar3 == (void *)0x0) {
            return 0x53;
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != 5);
        if (h != 0) {
          puVar11 = out + 1;
          uVar13 = 0;
          local_4f0 = (uchar *)0x0;
          uVar5 = 0;
          uVar9 = 0;
          do {
            lVar12 = uVar13 * length;
            lVar17 = 0;
LAB_0010f521:
            do {
              uVar4 = uVar5;
              lVar6 = lVar17;
              uVar15 = uVar9;
              puVar14 = *(uchar **)(&local_438[0].btype + lVar6 * 2);
              filterScanline(puVar14,in + lVar12,local_4f0,length,uVar10,(uchar)lVar6);
              if (lVar6 == 0) {
                uVar9 = 0;
                lVar17 = 1;
                uVar5 = 0;
                if (uVar7 < 8) goto LAB_0010f521;
                lVar17 = 0;
                uVar9 = 0;
                do {
                  uVar9 = uVar9 + puVar14[lVar17];
                  lVar17 = lVar17 + 1;
                } while (uVar19 != (uint)lVar17);
LAB_0010f5a7:
                if (lVar6 != 0) goto LAB_0010f5ac;
                uVar5 = 0;
              }
              else {
                if (7 < uVar7) {
                  lVar17 = 0;
                  uVar9 = 0;
                  do {
                    bVar1 = puVar14[lVar17];
                    uVar5 = bVar1 ^ 0xff;
                    if (-1 < (char)bVar1) {
                      uVar5 = (uint)bVar1;
                    }
                    uVar9 = uVar9 + uVar5;
                    lVar17 = lVar17 + 1;
                  } while (uVar19 != (uint)lVar17);
                  goto LAB_0010f5a7;
                }
                uVar9 = 0;
LAB_0010f5ac:
                bVar20 = uVar15 <= uVar9;
                if (bVar20) {
                  uVar9 = uVar15;
                }
                if (!bVar20) {
                  uVar4 = (uint)lVar6;
                }
                uVar5 = uVar4 & 0xff;
              }
              lVar17 = lVar6 + 1;
            } while (lVar6 + 1 != 5);
            out[(length + 1) * uVar13] = (uchar)uVar5;
            if (7 < uVar7) {
              lVar17 = *(long *)(&local_438[0].btype + (ulong)uVar5 * 2);
              lVar6 = 0;
              do {
                puVar11[lVar6] = *(uchar *)(lVar17 + lVar6);
                lVar6 = lVar6 + 1;
              } while (uVar19 != (uint)lVar6);
            }
            uVar13 = uVar13 + 1;
            puVar11 = puVar11 + length + 1;
            local_4f0 = in + lVar12;
          } while (uVar13 != uVar8);
        }
        lVar17 = 0;
        do {
          free(*(void **)(&local_438[0].btype + lVar17 * 2));
          lVar17 = lVar17 + 1;
        } while (lVar17 != 5);
        break;
      case 2:
        lVar17 = 0;
        do {
          pvVar3 = malloc(length);
          auStack_498[lVar17] = (ulong)pvVar3;
          if (pvVar3 == (void *)0x0) {
            return 0x53;
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != 5);
        if (h != 0) {
          lVar17 = length + 1;
          puVar11 = out + 1;
          fVar21 = 0.0;
          uVar13 = 0;
          uVar9 = 0;
          puVar14 = (uchar *)0x0;
          do {
            lVar12 = uVar13 * length;
            uVar15 = 0;
            do {
              puVar2 = (uchar *)auStack_498[uVar15];
              filterScanline(puVar2,in + lVar12,puVar14,length,uVar10,(uchar)uVar15);
              memset(local_438,0,0x400);
              if (7 < uVar7) {
                lVar6 = 0;
                do {
                  (&local_438[0].btype)[puVar2[lVar6]] = (&local_438[0].btype)[puVar2[lVar6]] + 1;
                  lVar6 = lVar6 + 1;
                } while (uVar19 != (uint)lVar6);
              }
              (&local_438[0].btype)[uVar15] = (&local_438[0].btype)[uVar15] + 1;
              fVar22 = 0.0;
              lVar6 = 0;
              do {
                fVar23 = 0.0;
                if ((&local_438[0].btype)[lVar6] != 0) {
                  fVar23 = (float)(&local_438[0].btype)[lVar6] / (float)(int)lVar17;
                  fVar25 = 0.0;
                  for (fVar24 = 1.0 / fVar23; 32.0 < fVar24; fVar24 = fVar24 * 0.0625) {
                    fVar25 = fVar25 + 4.0;
                  }
                  for (; 2.0 < fVar24; fVar24 = fVar24 * 0.5) {
                    fVar25 = fVar25 + 1.0;
                  }
                  fVar23 = fVar23 * ((fVar24 * fVar24 * 3.0 * -0.5 +
                                      (fVar24 * fVar24 * fVar24) / 3.0 + fVar24 * 3.0 + -1.83333) *
                                     1.442695 + fVar25);
                }
                fVar22 = fVar22 + fVar23;
                lVar6 = lVar6 + 1;
              } while (lVar6 != 0x100);
              if (fVar22 < fVar21 || uVar15 == 0) {
                uVar9 = uVar15 & 0xffffffff;
                fVar21 = fVar22;
              }
              uVar15 = uVar15 + 1;
            } while (uVar15 != 5);
            out[lVar17 * uVar13] = (uchar)uVar9;
            if (7 < uVar7) {
              uVar15 = auStack_498[uVar9];
              lVar6 = 0;
              do {
                puVar11[lVar6] = *(uchar *)(uVar15 + lVar6);
                lVar6 = lVar6 + 1;
              } while (uVar19 != (uint)lVar6);
            }
            uVar13 = uVar13 + 1;
            puVar11 = puVar11 + lVar17;
            puVar14 = in + lVar12;
          } while (uVar13 != uVar8);
        }
        lVar17 = 0;
        do {
          free((void *)auStack_498[lVar17]);
          lVar17 = lVar17 + 1;
        } while (lVar17 != 5);
        break;
      case 3:
        local_438[0]._8_8_ = in_stack_00000008[1];
        local_438[0]._16_8_ = in_stack_00000008[2];
        local_438[0].custom_context = (void *)in_stack_00000008[5];
        local_438[0].use_lz77 = (uint)((ulong)*in_stack_00000008 >> 0x20);
        local_438[0].btype = 1;
        local_438[0].custom_zlib =
             (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0
        ;
        local_438[0].custom_deflate =
             (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0
        ;
        lVar17 = 0;
        do {
          pvVar3 = malloc(length);
          alStack_468[lVar17] = (long)pvVar3;
          if (pvVar3 == (void *)0x0) {
            return 0x53;
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != 5);
        if (h != 0) {
          puVar11 = out + 1;
          uVar13 = 0;
          uVar15 = 0;
          uVar9 = 0;
          local_4f0 = (uchar *)0x0;
          do {
            lVar12 = uVar13 * length;
            lVar17 = 0;
            uVar18 = 0;
            do {
              puVar14 = (uchar *)alStack_468[uVar18];
              filterScanline(puVar14,in + lVar12,local_4f0,length,uVar10,(uchar)uVar18);
              auStack_498[uVar18] = 0;
              local_4a0 = (uchar *)0x0;
              if (local_438[0].custom_zlib ==
                  (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr
                   *)0x0) {
                lodepng_zlib_compress
                          (&local_4a0,(size_t *)((long)auStack_498 + lVar17),puVar14,length,
                           local_438);
              }
              else {
                (*local_438[0].custom_zlib)
                          (&local_4a0,(size_t *)((long)auStack_498 + lVar17),puVar14,length,
                           local_438);
              }
              free(local_4a0);
              if (auStack_498[uVar18] < uVar9 || uVar18 == 0) {
                uVar15 = uVar18 & 0xffffffff;
                uVar9 = auStack_498[uVar18];
              }
              uVar18 = uVar18 + 1;
              lVar17 = lVar17 + 8;
            } while (uVar18 != 5);
            out[(length + 1) * uVar13] = (uchar)uVar15;
            if (7 < uVar7) {
              lVar17 = alStack_468[uVar15];
              lVar6 = 0;
              do {
                puVar11[lVar6] = *(uchar *)(lVar17 + lVar6);
                lVar6 = lVar6 + 1;
              } while (uVar19 != (uint)lVar6);
            }
            uVar13 = uVar13 + 1;
            puVar11 = puVar11 + length + 1;
            local_4f0 = in + lVar12;
          } while (uVar13 != uVar8);
        }
        lVar17 = 0;
        do {
          free((void *)alStack_468[lVar17]);
          lVar17 = lVar17 + 1;
        } while (lVar17 != 5);
        break;
      case 4:
        if (h != 0) {
          puVar14 = out + 1;
          uVar9 = 0;
          puVar11 = (uchar *)0x0;
          do {
            puVar2 = in;
            filterType = *(uchar *)(in_stack_00000008[8] + uVar9);
            puVar14[-1] = filterType;
            filterScanline(puVar14,puVar2,puVar11,length,uVar10,filterType);
            uVar9 = uVar9 + 1;
            puVar14 = puVar14 + length + 1;
            in = puVar2 + length;
            puVar11 = puVar2;
          } while (uVar8 != uVar9);
        }
      }
      uVar5 = 0;
    }
    else {
      uVar5 = 0x58;
    }
  }
  return uVar5;
}

Assistant:

static unsigned filter(unsigned char* out, const unsigned char* in, unsigned w, unsigned h,
                       const LodePNGColorMode* info, const LodePNGEncoderSettings* settings)
{
  /*
  For PNG filter method 0
  out must be a buffer with as size: h + (w * h * bpp + 7) / 8, because there are
  the scanlines with 1 extra byte per scanline
  */

  unsigned bpp = lodepng_get_bpp(info);
  /*the width of a scanline in bytes, not including the filter type*/
  size_t linebytes = (w * bpp + 7) / 8;
  /*bytewidth is used for filtering, is 1 when bpp < 8, number of bytes per pixel otherwise*/
  size_t bytewidth = (bpp + 7) / 8;
  const unsigned char* prevline = 0;
  unsigned x, y;
  unsigned error = 0;
  LodePNGFilterStrategy strategy = settings->filter_strategy;

  /*
  There is a heuristic called the minimum sum of absolute differences heuristic, suggested by the PNG standard:
   *  If the image type is Palette, or the bit depth is smaller than 8, then do not filter the image (i.e.
      use fixed filtering, with the filter None).
   * (The other case) If the image type is Grayscale or RGB (with or without Alpha), and the bit depth is
     not smaller than 8, then use adaptive filtering heuristic as follows: independently for each row, apply
     all five filters and select the filter that produces the smallest sum of absolute values per row.
  This heuristic is used if filter strategy is LFS_MINSUM and filter_palette_zero is true.

  If filter_palette_zero is true and filter_strategy is not LFS_MINSUM, the above heuristic is followed,
  but for "the other case", whatever strategy filter_strategy is set to instead of the minimum sum
  heuristic is used.
  */
  if(settings->filter_palette_zero &&
     (info->colortype == LCT_PALETTE || info->bitdepth < 8)) strategy = LFS_ZERO;

  if(bpp == 0) return 31; /*error: invalid color type*/

  if(strategy == LFS_ZERO)
  {
    for(y = 0; y != h; ++y)
    {
      size_t outindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
      size_t inindex = linebytes * y;
      out[outindex] = 0; /*filter type byte*/
      filterScanline(&out[outindex + 1], &in[inindex], prevline, linebytes, bytewidth, 0);
      prevline = &in[inindex];
    }
  }
  else if(strategy == LFS_MINSUM)
  {
    /*adaptive filtering*/
    size_t sum[5];
    unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t smallest = 0;
    unsigned char type, bestType = 0;

    for(type = 0; type != 5; ++type)
    {
      attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
      if(!attempt[type]) return 83; /*alloc fail*/
    }

    if(!error)
    {
      for(y = 0; y != h; ++y)
      {
        /*try the 5 filter types*/
        for(type = 0; type != 5; ++type)
        {
          filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);

          /*calculate the sum of the result*/
          sum[type] = 0;
          if(type == 0)
          {
            for(x = 0; x != linebytes; ++x) sum[type] += (unsigned char)(attempt[type][x]);
          }
          else
          {
            for(x = 0; x != linebytes; ++x)
            {
              /*For differences, each byte should be treated as signed, values above 127 are negative
              (converted to signed char). Filtertype 0 isn't a difference though, so use unsigned there.
              This means filtertype 0 is almost never chosen, but that is justified.*/
              unsigned char s = attempt[type][x];
              sum[type] += s < 128 ? s : (255U - s);
            }
          }

          /*check if this is smallest sum (or if type == 0 it's the first case so always store the values)*/
          if(type == 0 || sum[type] < smallest)
          {
            bestType = type;
            smallest = sum[type];
          }
        }

        prevline = &in[y * linebytes];

        /*now fill the out values*/
        out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
        for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
      }
    }

    for(type = 0; type != 5; ++type) lodepng_free(attempt[type]);
  }
  else if(strategy == LFS_ENTROPY)
  {
    float sum[5];
    unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
    float smallest = 0;
    unsigned type, bestType = 0;
    unsigned count[256];

    for(type = 0; type != 5; ++type)
    {
      attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
      if(!attempt[type]) return 83; /*alloc fail*/
    }

    for(y = 0; y != h; ++y)
    {
      /*try the 5 filter types*/
      for(type = 0; type != 5; ++type)
      {
        filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);
        for(x = 0; x != 256; ++x) count[x] = 0;
        for(x = 0; x != linebytes; ++x) ++count[attempt[type][x]];
        ++count[type]; /*the filter type itself is part of the scanline*/
        sum[type] = 0;
        for(x = 0; x != 256; ++x)
        {
          float p = count[x] / (float)(linebytes + 1);
          sum[type] += count[x] == 0 ? 0 : flog2(1 / p) * p;
        }
        /*check if this is smallest sum (or if type == 0 it's the first case so always store the values)*/
        if(type == 0 || sum[type] < smallest)
        {
          bestType = type;
          smallest = sum[type];
        }
      }

      prevline = &in[y * linebytes];

      /*now fill the out values*/
      out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
      for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
    }

    for(type = 0; type != 5; ++type) lodepng_free(attempt[type]);
  }
  else if(strategy == LFS_PREDEFINED)
  {
    for(y = 0; y != h; ++y)
    {
      size_t outindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
      size_t inindex = linebytes * y;
      unsigned char type = settings->predefined_filters[y];
      out[outindex] = type; /*filter type byte*/
      filterScanline(&out[outindex + 1], &in[inindex], prevline, linebytes, bytewidth, type);
      prevline = &in[inindex];
    }
  }
  else if(strategy == LFS_BRUTE_FORCE)
  {
    /*brute force filter chooser.
    deflate the scanline after every filter attempt to see which one deflates best.
    This is very slow and gives only slightly smaller, sometimes even larger, result*/
    size_t size[5];
    unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t smallest = 0;
    unsigned type = 0, bestType = 0;
    unsigned char* dummy;
    LodePNGCompressSettings zlibsettings = settings->zlibsettings;
    /*use fixed tree on the attempts so that the tree is not adapted to the filtertype on purpose,
    to simulate the true case where the tree is the same for the whole image. Sometimes it gives
    better result with dynamic tree anyway. Using the fixed tree sometimes gives worse, but in rare
    cases better compression. It does make this a bit less slow, so it's worth doing this.*/
    zlibsettings.btype = 1;
    /*a custom encoder likely doesn't read the btype setting and is optimized for complete PNG
    images only, so disable it*/
    zlibsettings.custom_zlib = 0;
    zlibsettings.custom_deflate = 0;
    for(type = 0; type != 5; ++type)
    {
      attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
      if(!attempt[type]) return 83; /*alloc fail*/
    }
    for(y = 0; y != h; ++y) /*try the 5 filter types*/
    {
      for(type = 0; type != 5; ++type)
      {
        unsigned testsize = linebytes;
        /*if(testsize > 8) testsize /= 8;*/ /*it already works good enough by testing a part of the row*/

        filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);
        size[type] = 0;
        dummy = 0;
        zlib_compress(&dummy, &size[type], attempt[type], testsize, &zlibsettings);
        lodepng_free(dummy);
        /*check if this is smallest size (or if type == 0 it's the first case so always store the values)*/
        if(type == 0 || size[type] < smallest)
        {
          bestType = type;
          smallest = size[type];
        }
      }
      prevline = &in[y * linebytes];
      out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
      for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
    }
    for(type = 0; type != 5; ++type) lodepng_free(attempt[type]);
  }
  else return 88; /* unknown filter strategy */

  return error;
}